

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

OperatorPartitionData *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetPartitionData
          (ClientContext *context,TableFunctionGetPartitionInput *input)

{
  MultiFileBindData *pMVar1;
  pointer pMVar2;
  MultiFileReaderData *pMVar3;
  long in_RDX;
  optional_ptr<duckdb::MultiFileReaderData,_true> *in_RSI;
  OperatorPartitionData *in_RDI;
  MultiFileGlobalState *gstate;
  MultiFileLocalState *data;
  MultiFileBindData *bind_data;
  OperatorPartitionData *partition_data;
  unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
  *in_stack_ffffffffffffff78;
  OperatorPartitionData *in_stack_ffffffffffffff80;
  undefined8 local_50;
  
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffff80);
  pMVar1 = FunctionData::CastNoConst<duckdb::MultiFileBindData>((FunctionData *)0x6525f8);
  optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)in_stack_ffffffffffffff80);
  LocalTableFunctionState::Cast<duckdb::MultiFileLocalState>
            ((LocalTableFunctionState *)in_stack_ffffffffffffff80);
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_ffffffffffffff80);
  GlobalTableFunctionState::Cast<duckdb::MultiFileGlobalState>
            ((GlobalTableFunctionState *)in_stack_ffffffffffffff80);
  OperatorPartitionData::OperatorPartitionData
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
  pMVar2 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)in_stack_ffffffffffffff80);
  pMVar3 = optional_ptr<duckdb::MultiFileReaderData,_true>::operator*(in_RSI);
  optional_ptr<duckdb::MultiFileReaderGlobalState,_true>::optional_ptr
            ((optional_ptr<duckdb::MultiFileReaderGlobalState,_true> *)in_RSI,
             in_stack_ffffffffffffff78);
  (**(code **)(*(long *)pMVar2 + 0x68))
            (pMVar2,in_RSI,&pMVar1->reader_bind,pMVar3,local_50,*(undefined8 *)(in_RDX + 0x18),
             in_RDI);
  return in_RDI;
}

Assistant:

static OperatorPartitionData MultiFileGetPartitionData(ClientContext &context,
	                                                       TableFunctionGetPartitionInput &input) {
		auto &bind_data = input.bind_data->CastNoConst<MultiFileBindData>();
		auto &data = input.local_state->Cast<MultiFileLocalState>();
		auto &gstate = input.global_state->Cast<MultiFileGlobalState>();
		OperatorPartitionData partition_data(data.batch_index);
		bind_data.multi_file_reader->GetPartitionData(context, bind_data.reader_bind, *data.reader_data,
		                                              gstate.multi_file_reader_state, input.partition_info,
		                                              partition_data);
		return partition_data;
	}